

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_operators.cpp
# Opt level: O0

void __thiscall
test_vector_operators_unit_Test::~test_vector_operators_unit_Test
          (test_vector_operators_unit_Test *this)

{
  test_vector_operators_unit_Test *this_local;
  
  ~test_vector_operators_unit_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_vector_operators, unit) {
  Vector_Dense<Scalar, 0> dynamic_vector = {1, -2, 3};
  Vector_Dense<Scalar, 3> static_vector = {-1, 2, -3};
  dynamic_vector = unit(dynamic_vector);
  static_vector = unit(static_vector);

  EXPECT_DOUBLE_EQ(dynamic_vector[0], 1.0 / std::sqrt(14.0));
  EXPECT_DOUBLE_EQ(dynamic_vector[1], -2.0 / std::sqrt(14.0));
  EXPECT_DOUBLE_EQ(dynamic_vector[2], 3.0 / std::sqrt(14.0));
  EXPECT_DOUBLE_EQ(static_vector[0], -1.0 / std::sqrt(14.0));
  EXPECT_DOUBLE_EQ(static_vector[1], 2.0 / std::sqrt(14.0));
  EXPECT_DOUBLE_EQ(static_vector[2], -3.0 / std::sqrt(14.0));

  dynamic_vector *= 0.0;
  static_vector *= 0.0;
  dynamic_vector[1] = std::numeric_limits<double>::min();
  static_vector[2] = std::numeric_limits<double>::min();
  dynamic_vector = unit(dynamic_vector);
  static_vector = unit(static_vector);

  EXPECT_DOUBLE_EQ(dynamic_vector[0], 0.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], 0.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], 0.0);
  EXPECT_DOUBLE_EQ(static_vector[0], 0.0);
  EXPECT_DOUBLE_EQ(static_vector[1], 0.0);
  EXPECT_DOUBLE_EQ(static_vector[2], 0.0);
}